

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O2

Result __thiscall wabt::anon_unknown_4::Validator::OnBrTableExpr(Validator *this,BrTableExpr *expr)

{
  SharedValidator *this_00;
  Location *loc;
  pointer pVVar1;
  Result RVar2;
  Var *var;
  pointer rhs;
  Var local_c0;
  Var local_78;
  
  this_00 = &this->validator_;
  loc = &(expr->super_ExprMixin<(wabt::ExprType)12>).super_Expr.loc;
  RVar2 = SharedValidator::BeginBrTable(this_00,loc);
  (this->result_).enum_ = (uint)(RVar2.enum_ == Error || (this->result_).enum_ == Error);
  pVVar1 = (expr->targets).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (rhs = (expr->targets).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>._M_impl.
             super__Vector_impl_data._M_start; rhs != pVVar1; rhs = rhs + 1) {
    Var::Var(&local_78,rhs);
    RVar2 = SharedValidator::OnBrTableTarget(this_00,loc,&local_78);
    (this->result_).enum_ = (uint)(RVar2.enum_ == Error || (this->result_).enum_ == Error);
    Var::~Var(&local_78);
  }
  Var::Var(&local_c0,&expr->default_target);
  RVar2 = SharedValidator::OnBrTableTarget(this_00,loc,&local_c0);
  (this->result_).enum_ = (uint)(RVar2.enum_ == Error || (this->result_).enum_ == Error);
  Var::~Var(&local_c0);
  RVar2 = SharedValidator::EndBrTable(this_00,loc);
  (this->result_).enum_ = (uint)(RVar2.enum_ == Error || (this->result_).enum_ == Error);
  return (Result)Ok;
}

Assistant:

Result Validator::OnBrTableExpr(BrTableExpr* expr) {
  result_ |= validator_.BeginBrTable(expr->loc);
  for (const Var& var : expr->targets) {
    result_ |= validator_.OnBrTableTarget(expr->loc, var);
  }
  result_ |= validator_.OnBrTableTarget(expr->loc, expr->default_target);
  result_ |= validator_.EndBrTable(expr->loc);
  return Result::Ok;
}